

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int grad_calc(custom_function *funcpt,double *x,int N,double *dx,double eps2,double *f)

{
  double *__ptr;
  double dVar1;
  double dVar2;
  double *xi;
  double stepmax;
  double fd;
  double step;
  int local_48;
  int retval;
  int j;
  int i;
  double *f_local;
  double eps2_local;
  double *dx_local;
  int N_local;
  double *x_local;
  custom_function *funcpt_local;
  
  __ptr = (double *)malloc((long)N << 3);
  retval = 0;
  while( true ) {
    if (N <= retval) {
      free(__ptr);
      return 0;
    }
    if (ABS(x[retval]) < 1.0 / ABS(dx[retval])) {
      dVar1 = signx(x[retval]);
      xi = (double *)((dVar1 * 1.0) / ABS(dx[retval]));
    }
    else {
      xi = (double *)x[retval];
    }
    for (local_48 = 0; local_48 < N; local_48 = local_48 + 1) {
      __ptr[local_48] = x[local_48];
    }
    __ptr[retval] = eps2 * (double)xi + __ptr[retval];
    dVar1 = (*funcpt->funcpt)(__ptr,N,funcpt->params);
    dVar2 = (*funcpt->funcpt)(x,N,funcpt->params);
    f[retval] = (dVar1 - dVar2) / (eps2 * (double)xi);
    if ((1.79769313486232e+308 <= f[retval]) || (f[retval] <= -1.79769313486232e+308)) break;
    if ((f[retval] != f[retval]) || (NAN(f[retval]) || NAN(f[retval]))) {
      printf("Program Exiting as the function returns NaN");
      free(__ptr);
      return 0xf;
    }
    retval = retval + 1;
  }
  printf("Program Exiting as the function value exceeds the maximum double value");
  free(__ptr);
  return 0xf;
}

Assistant:

int grad_calc(custom_function *funcpt, double *x, int N, double *dx, double eps2, double *f) {
	int i, j,retval;
	double step, fd, stepmax;
	double *xi;

	fd = eps2; // square root of macheps
	retval = 0;
	xi = (double*)malloc(sizeof(double)*N);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		}
		else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		step = fd * stepmax;
		for (j = 0; j < N; ++j) {
			xi[j] = x[j];
		}
		xi[i] += step;
		f[i] = (FUNCPT_EVAL(funcpt, xi, N) - FUNCPT_EVAL(funcpt, x, N)) / step;
		if (f[i] >= DBL_MAX || f[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(xi);
			return 15;
		}
		if (f[i] != f[i]) {
			printf("Program Exiting as the function returns NaN");
			free(xi);
			return 15;
		}
		//xi[i] -= step;
	}

	free(xi);
	return retval;

}